

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token)

{
  ushort uVar1;
  ValueHolder *pVVar2;
  bool bVar3;
  ValueHolder VVar4;
  _Elt_pointer ppVVar5;
  ushort uVar6;
  string decoded;
  ValueHolder local_50;
  ushort local_48;
  string local_40;
  undefined4 extraout_var;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  bVar3 = decodeString(this,token,&local_40);
  if (bVar3) {
    uVar6 = local_48 & 0xfe00;
    local_48 = uVar6 + 0x104;
    valueAllocator();
    VVar4._0_4_ = (*valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                            (valueAllocator::valueAllocator,local_40._M_dataplus._M_p,
                             local_40._M_string_length & 0xffffffff);
    VVar4._4_4_ = extraout_var;
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar5 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar2 = &ppVVar5[-1]->value_;
    local_50 = *pVVar2;
    *pVVar2 = VVar4;
    uVar1 = *(ushort *)(pVVar2 + 1);
    pVVar2[1].bool_ = true;
    *(ushort *)(pVVar2 + 1) = uVar1 & 0xff04 | 0x104;
    local_48 = uVar1 & 0x100 | uVar6 | uVar1 & 0xff;
    Value::~Value((Value *)&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool
Reader::decodeString ( Token& token )
{
    std::string decoded;

    if ( !decodeString ( token, decoded ) )
        return false;

    currentValue () = decoded;
    return true;
}